

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* spvtools::utils::SplitFlagArgs
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *flag)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  ulong uVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  byte local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  byte local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  byte local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  long local_48;
  size_t ix;
  size_t dash_ix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *flag_local;
  
  local_18 = flag;
  flag_local = &__return_storage_ptr__->first;
  uVar1 = std::__cxx11::string::size();
  __x = local_18;
  if (uVar1 < 2) {
    std::__cxx11::string::string((string *)&dash_ix);
    std::make_pair<std::__cxx11::string_const&,std::__cxx11::string>
              (__return_storage_ptr__,__x,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dash_ix);
    std::__cxx11::string::~string((string *)&dash_ix);
  }
  else {
    ix = 0;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
    if ((*pcVar2 == '-') &&
       (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18), *pcVar2 == '-')) {
      ix = 2;
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
      if (*pcVar2 == '-') {
        ix = 1;
      }
    }
    local_48 = std::__cxx11::string::find((char)local_18,0x3d);
    local_69 = 0;
    local_91 = 0;
    local_b9 = 0;
    if (local_48 == -1) {
      std::__cxx11::string::substr((ulong)&local_b8,(ulong)local_18);
      local_b9 = 1;
      std::__cxx11::string::string((string *)&local_e0);
      std::make_pair<std::__cxx11::string,std::__cxx11::string>
                (__return_storage_ptr__,&local_b8,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_68,(ulong)local_18);
      local_69 = 1;
      std::__cxx11::string::substr((ulong)&local_90,(ulong)local_18);
      local_91 = 1;
      std::make_pair<std::__cxx11::string,std::__cxx11::string>
                (__return_storage_ptr__,&local_68,&local_90);
    }
    if ((local_b9 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_b8);
    }
    if ((local_91 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_90);
    }
    if ((local_69 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_68);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string> SplitFlagArgs(const std::string& flag) {
  if (flag.size() < 2) return make_pair(flag, std::string());

  // Detect the last dash before the pass name. Since we have to
  // handle single dash options (-O and -Os), count up to two dashes.
  size_t dash_ix = 0;
  if (flag[0] == '-' && flag[1] == '-')
    dash_ix = 2;
  else if (flag[0] == '-')
    dash_ix = 1;

  size_t ix = flag.find('=');
  return (ix != std::string::npos)
             ? make_pair(flag.substr(dash_ix, ix - 2), flag.substr(ix + 1))
             : make_pair(flag.substr(dash_ix), std::string());
}